

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

int main_sqrtAddcbrt(void)

{
  uint uVar1;
  uint uVar2;
  ostream *poVar3;
  uint uVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  int iVar9;
  undefined1 auVar8 [16];
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  vector<double,_std::allocator<double>_> output;
  vector<double,_std::allocator<double>_> data;
  FC_BPNN bp;
  double local_138;
  allocator_type local_12a;
  allocator_type local_129;
  undefined1 local_128 [24];
  double local_110;
  vector<double,_std::allocator<double>_> local_108;
  vector<double,_std::allocator<double>_> local_e8;
  double local_c8;
  double local_c0;
  vector<double,_std::allocator<double>_> local_b8;
  vector<double,_std::allocator<double>_> local_a0;
  undefined1 local_88 [16];
  FC_BPNN local_78;
  
  FC_BPNN::FC_BPNN(&local_78,2,6,7,1);
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3fd010624dd2f1aa;
  std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
            (&local_e8,(iterator)0x0,(double *)&local_108);
  local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3f9c0ebedfa43fe6;
  if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&local_e8,
               (iterator)
               local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,(double *)&local_108);
  }
  else {
    *local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0.0274;
    local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar4 = 1;
  local_110 = 0.0;
  local_138 = 0.0;
  do {
    uVar1 = rand();
    uVar2 = rand();
    iVar5 = (int)((ulong)uVar1 * 0x10624dd3 >> 0x20) - (-(uint)((int)uVar1 < 0) & 0x10624dd3);
    iVar9 = (int)((ulong)uVar2 * 0x10624dd3 >> 0x20) - (-(uint)((int)uVar2 < 0) & 0x10624dd3);
    auVar8._0_8_ = (double)(int)(uVar1 + ((iVar5 >> 6) - (iVar5 >> 0x1f)) * -1000);
    auVar8._8_8_ = (double)(int)(uVar2 + ((iVar9 >> 6) - (iVar9 >> 0x1f)) * -1000);
    local_128._0_16_ = divpd(auVar8,_DAT_00106160);
    __l._M_len = 2;
    __l._M_array = (iterator)local_88;
    local_88 = local_128._0_16_;
    std::vector<double,_std::allocator<double>_>::vector(&local_a0,__l,&local_129);
    if ((double)local_128._0_8_ < 0.0) {
      local_c8 = sqrt((double)local_128._0_8_);
    }
    else {
      local_c8 = SQRT((double)local_128._0_8_);
    }
    local_c0 = cbrt((double)local_128._8_8_);
    local_c0 = local_c0 + local_c8;
    __l_00._M_len = 1;
    __l_00._M_array = &local_c0;
    std::vector<double,_std::allocator<double>_>::vector(&local_b8,__l_00,&local_12a);
    dVar6 = FC_BPNN::train_once(&local_78,&local_a0,&local_b8);
    local_128._0_8_ = dVar6;
    if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_138 = local_138 + (double)local_128._0_8_;
    if ((short)((short)((uVar4 & 0xffff) / 100) * -100 + (short)uVar4) == 0) {
      dVar6 = local_138 / 100.0;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"iter: ",6);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," cost: ",7);
      poVar3 = std::ostream::_M_insert<double>(dVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," step: ",7);
      dVar7 = FC_BPNN::getLearningStep(&local_78);
      poVar3 = std::ostream::_M_insert<double>(dVar7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if ((local_110 - dVar6) / local_110 <= 0.1) {
        dVar7 = FC_BPNN::getLearningStep(&local_78);
        FC_BPNN::setLearningStep(&local_78,dVar7 * 0.5);
        local_138 = 0.0;
        local_110 = dVar6;
      }
      else {
        local_138 = 0.0;
        local_110 = dVar6;
      }
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x3e9);
  FC_BPNN::predict(&local_78,&local_e8,&local_108);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"prediction: ",0xc);
  poVar3 = std::ostream::_M_insert<double>
                     (*local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," gt: ",5);
  dVar6 = *local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (dVar6 < 0.0) {
    local_128._0_8_ =
         local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[1];
    dVar6 = sqrt(dVar6);
    dVar7 = (double)local_128._0_8_;
  }
  else {
    dVar6 = SQRT(dVar6);
    dVar7 = local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[1];
  }
  dVar7 = cbrt(dVar7);
  poVar3 = std::ostream::_M_insert<double>(dVar7 + dVar6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  FC_BPNN::~FC_BPNN(&local_78);
  return 1;
}

Assistant:

int main_sqrtAddcbrt() {
	FC_BPNN bp(2, 6, 7, 1);
	std::vector<double> data; data.push_back(0.251); data.push_back(0.0274);
	std::vector<double> output;
	double lastCost = 0.0; double cost = 0.0;
	for (int i = 1; i <= 1000; i++) {
		double a = (double)(rand() % 1000) / 1000;
		double b = (double)(rand() % 1000) / 1000;
		cost += bp.train_once({ a ,b }, { square_root_add_cube_root(a,b) });
		if (i % 100 == 0) {
			cost /= 100;
			std::cout << "iter: " << i << " cost: " << cost << " step: " << bp.getLearningStep() << std::endl;
			double costRate = (lastCost - cost) / lastCost;
			if (costRate <= 0.1) {
				bp.setLearningStep(bp.getLearningStep() / 2);
			}
			lastCost = cost;
			cost = 0.0;
		}
	}
	bp.predict(data, output);
	std::cout << "prediction: " << output[0] << " gt: " << square_root_add_cube_root(data[0], data[1]) << std::endl;
	return 1;
}